

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_Write(UA_Server *server,UA_Session *session,UA_WriteRequest *request,
                  UA_WriteResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  UA_NodeId *nodeId;
  long lVar3;
  size_t size;
  size_t i;
  ulong uVar4;
  
  size = request->nodesToWriteSize;
  if (size == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)UA_Array_new(size,UA_TYPES + 0x12);
    response->results = pUVar2;
    if (pUVar2 != (UA_StatusCode *)0x0) {
      response->resultsSize = size;
      lVar3 = 0;
      for (uVar4 = 0; uVar4 < size; uVar4 = uVar4 + 1) {
        nodeId = (UA_NodeId *)((long)&(request->nodesToWrite->nodeId).namespaceIndex + lVar3);
        UVar1 = UA_Server_editNode(server,session,nodeId,CopyAttributeIntoNode,nodeId);
        response->results[uVar4] = UVar1;
        size = request->nodesToWriteSize;
        lVar3 = lVar3 + 0x90;
      }
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void
Service_Write(UA_Server *server, UA_Session *session,
              const UA_WriteRequest *request, UA_WriteResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing WriteRequest");
    if(request->nodesToWriteSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->nodesToWriteSize, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->nodesToWriteSize;

#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    for(size_t i = 0;i < request->nodesToWriteSize;++i) {
        response->results[i] = UA_Server_editNode(server, session, &request->nodesToWrite[i].nodeId,
                                                  (UA_EditNodeCallback)CopyAttributeIntoNode,
                                                  &request->nodesToWrite[i]);
    }
#else
    UA_Boolean isExternal[request->nodesToWriteSize];
    UA_UInt32 indices[request->nodesToWriteSize];
    memset(isExternal, false, sizeof(UA_Boolean)*request->nodesToWriteSize);
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        UA_UInt32 indexSize = 0;
        for(size_t i = 0; i < request->nodesToWriteSize; ++i) {
            if(request->nodesToWrite[i].nodeId.namespaceIndex !=
               server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->writeNodes(ens->ensHandle, &request->requestHeader, request->nodesToWrite,
                        indices, indexSize, response->results, response->diagnosticInfos);
    }
    for(size_t i = 0;i < request->nodesToWriteSize;++i) {
        if(isExternal[i])
            continue;
        response->results[i] = UA_Server_editNode(server, session, &request->nodesToWrite[i].nodeId,
                                                  (UA_EditNodeCallback)CopyAttributeIntoNode,
                                                  &request->nodesToWrite[i]);
    }
#endif
}